

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

void g_hash_table_foreach(GHashTable *hash_table,GHFunc func,gpointer user_data)

{
  GHashNode *pGVar1;
  long lVar2;
  long lVar3;
  
  if (func != (GHFunc)0x0 && hash_table != (GHashTable *)0x0) {
    lVar2 = 0x10;
    for (lVar3 = 0; lVar3 < hash_table->size; lVar3 = lVar3 + 1) {
      pGVar1 = hash_table->nodes;
      if (1 < *(uint *)((long)&pGVar1->key + lVar2)) {
        (*func)(*(gpointer *)((long)pGVar1 + lVar2 + -0x10),*(gpointer *)((long)pGVar1 + lVar2 + -8)
                ,user_data);
      }
      lVar2 = lVar2 + 0x18;
    }
  }
  return;
}

Assistant:

void g_hash_table_foreach (GHashTable *hash_table,
        GHFunc      func,
        gpointer    user_data)
{
    gint i;

    if (hash_table == NULL) return;
    if (func == NULL) return;

    for (i = 0; i < hash_table->size; i++)
    {
        GHashNode *node = &hash_table->nodes [i];

        if (node->key_hash > 1)
            (* func) (node->key, node->value, user_data);
    }
}